

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O0

QSize __thiscall QTransposeProxyModel::span(QTransposeProxyModel *this,QModelIndex *index)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  parameter_type pQVar4;
  arrow_operator_result ppQVar5;
  undefined4 extraout_var;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QTransposeProxyModelPrivate *d;
  QSize *in_stack_ffffffffffffff98;
  QModelIndex *in_stack_ffffffffffffffa0;
  undefined1 local_30 [24];
  undefined8 local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QTransposeProxyModel *)0x8b36cf);
  pQVar4 = ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                     ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                       *)0x8b36e5);
  if (pQVar4 != (parameter_type)0x0) {
    bVar2 = QModelIndex::isValid(in_stack_ffffffffffffffa0);
    if (bVar2) {
      ppQVar5 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                              *)in_stack_ffffffffffffffa0);
      pQVar1 = *ppQVar5;
      (**(code **)(*in_RDI + 400))(local_30,in_RDI,in_RSI);
      iVar3 = (*(pQVar1->super_QObject)._vptr_QObject[0x2b])(pQVar1,local_30);
      local_18 = CONCAT44(extraout_var,iVar3);
      local_10 = QSize::transposed(in_stack_ffffffffffffff98);
      goto LAB_008b375d;
    }
  }
  QSize::QSize((QSize *)in_stack_ffffffffffffffa0);
LAB_008b375d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QTransposeProxyModel::span(const QModelIndex &index) const
{
    Q_D(const QTransposeProxyModel);
    Q_ASSERT(checkIndex(index));
    if (!d->model || !index.isValid())
        return QSize();
    return d->model->span(mapToSource(index)).transposed();
}